

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

bool __thiscall
basist::basisu_transcoder::validate_header(basisu_transcoder *this,void *pData,uint32_t data_size)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  
  if ((((0x4d < data_size) && (*pData == 0x4273)) && (*(short *)((long)pData + 2) == 0x13)) &&
     (((*(short *)((long)pData + 4) == 0x4d && (*(int *)((long)pData + 8) + 0x4dU <= data_size)) &&
      (*(uint3 *)((long)pData + 0x11) != 0)))) {
    uVar3 = (uint)*(uint3 *)((long)pData + 0xe);
    if (*(uint3 *)((long)pData + 0x11) <= uVar3) {
      uVar1 = *(ushort *)((long)pData + 0x15);
      if (*(char *)((long)pData + 0x14) == '\0') {
        if ((uVar1 & 1) == 0) {
          return false;
        }
        if ((*(byte *)((long)pData + 0xe) & (byte)((uVar1 & 4) >> 2)) != 0) {
          return false;
        }
      }
      else if ((uVar1 & 1) != 0) {
        return false;
      }
      uVar2 = *(uint *)((long)pData + 0x41);
      if (*(uint *)((long)pData + 0x41) <= data_size && data_size != uVar2) {
        return uVar3 * 0x17 <= data_size - uVar2;
      }
    }
  }
  return false;
}

Assistant:

bool basisu_transcoder::validate_header(const void* pData, uint32_t data_size) const
	{
		if (data_size <= sizeof(basis_file_header))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: input source buffer is too small\n");
			return false;
		}

		const basis_file_header* pHeader = reinterpret_cast<const basis_file_header*>(pData);

		if ((pHeader->m_sig != basis_file_header::cBASISSigValue) || (pHeader->m_ver != BASISD_SUPPORTED_BASIS_VERSION) || (pHeader->m_header_size != sizeof(basis_file_header)))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: header has an invalid signature, or file version is unsupported\n");
			return false;
		}

		uint32_t expected_file_size = sizeof(basis_file_header) + pHeader->m_data_size;
		if (data_size < expected_file_size)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: input source buffer is too small, or header is corrupted\n");
			return false;
		}

		if ((!pHeader->m_total_images) || (!pHeader->m_total_slices))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: invalid basis file (total images or slices are 0)\n");
			return false;
		}

		if (pHeader->m_total_images > pHeader->m_total_slices)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: invalid basis file (too many images)\n");
			return false;
		}

		if (pHeader->m_tex_format == (int)basis_tex_format::cETC1S)
		{
			if (pHeader->m_flags & cBASISHeaderFlagHasAlphaSlices)
			{
				if (pHeader->m_total_slices & 1)
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: invalid alpha .basis file\n");
					return false;
				}
			}
		
			// This flag dates back to pre-Basis Universal, when .basis supported full ETC1 too.
			if ((pHeader->m_flags & cBASISHeaderFlagETC1S) == 0)
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: Invalid .basis file (ETC1S check)\n");
				return false;
			}
		}
		else
		{
			if ((pHeader->m_flags & cBASISHeaderFlagETC1S) != 0)
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: Invalid .basis file (ETC1S check)\n");
				return false;
			}
		}
		
		if ((pHeader->m_slice_desc_file_ofs >= data_size) ||
			((data_size - pHeader->m_slice_desc_file_ofs) < (sizeof(basis_slice_desc) * pHeader->m_total_slices))
			)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::validate_header_quick: passed in buffer is too small or data is corrupted\n");
			return false;
		}

		return true;
	}